

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O2

void __thiscall crnlib::command_line_params::clear(command_line_params *this)

{
  vector<crnlib::dynamic_string>::clear(&this->m_params);
  std::
  _Rb_tree<crnlib::dynamic_string,_std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>,_std::_Select1st<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>,_std::less<crnlib::dynamic_string>,_std::allocator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
  ::clear(&(this->m_param_map)._M_t);
  return;
}

Assistant:

void command_line_params::clear() {
  m_params.clear();

  m_param_map.clear();
}